

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void deld(int d,double *C)

{
  double *B;
  double *A;
  long lVar1;
  int lA;
  long lVar2;
  
  B = (double *)malloc(0x10);
  A = (double *)malloc((long)d * 8 + 8);
  *B = 1.0;
  B[1] = -1.0;
  *A = 1.0;
  lA = 0;
  if (d < 1) {
    d = 0;
  }
  lVar2 = 2;
  while (lA != d) {
    lA = lA + 1;
    poly(A,B,C,lA,2);
    for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
      A[lVar1] = C[lVar1];
    }
    lVar2 = lVar2 + 1;
  }
  free(B);
  free(A);
  return;
}

Assistant:

void deld(int d, double* C) {
	int i,j;
	double *vec,*oup;
	/*
	 * deld returns coefficients of [1,-1]^d
	 * eg.,
	 * d=2 yields [1,-2,1]
	 * d=3 [1,-3,3,1]
	 */ 
	vec = (double*) malloc(sizeof(double) * 2);
	oup = (double*) malloc(sizeof(double) * (d+1));
	vec[0] = 1.;
	vec[1] = -1.;
	oup[0] = 1.;
	// oup has length (d+1)
	
	for(i = 0; i < d; ++i) {
		poly(oup,vec,C,i+1,2);
		for(j = 0; j < i+2; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}